

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

CharFormat testing::internal::PrintAsCharLiteralTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  void *pvVar1;
  long lVar2;
  char *pcVar3;
  char local_41;
  char local_40;
  undefined7 uStack_3f;
  long local_38;
  
  switch(c) {
  case L'\0':
    pcVar3 = "\\0";
    break;
  case L'\x01':
  case L'\x02':
  case L'\x03':
  case L'\x04':
  case L'\x05':
  case L'\x06':
switchD_0012e9b0_caseD_1:
    if ((uint)(c + L'\xffffffe0') < 0x5f) {
      local_40 = (char)c;
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_40,1);
      return kAsIs;
    }
    String::Format(&local_40,"\\x%X");
    pvVar1 = (void *)CONCAT71(uStack_3f,local_40);
    if (pvVar1 == (void *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"(null)",6);
    }
    else {
      if (local_38 != 0) {
        lVar2 = 0;
        do {
          if (*(char *)((long)pvVar1 + lVar2) == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
          }
          else {
            local_41 = *(char *)((long)pvVar1 + lVar2);
            std::__ostream_insert<char,std::char_traits<char>>(os,&local_41,1);
          }
          lVar2 = lVar2 + 1;
        } while (local_38 != lVar2);
      }
      operator_delete__(pvVar1);
    }
    return kHexEscape;
  case L'\a':
    pcVar3 = "\\a";
    break;
  case L'\b':
    pcVar3 = "\\b";
    break;
  case L'\t':
    pcVar3 = "\\t";
    break;
  case L'\n':
    pcVar3 = "\\n";
    break;
  case L'\v':
    pcVar3 = "\\v";
    break;
  case L'\f':
    pcVar3 = "\\f";
    break;
  case L'\r':
    pcVar3 = "\\r";
    break;
  default:
    if (c == L'\'') {
      pcVar3 = "\\\'";
    }
    else {
      if (c != L'\\') goto switchD_0012e9b0_caseD_1;
      pcVar3 = "\\\\";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,2);
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  switch (static_cast<wchar_t>(c)) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        *os << String::Format("\\x%X", static_cast<UnsignedChar>(c));
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}